

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::flash_wait(Spi *this)

{
  int local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  ushort local_16;
  int local_14;
  uint8_t data [2];
  Spi *pSStack_10;
  int count;
  Spi *this_local;
  
  pSStack_10 = this;
  if ((this->verbose & 1U) != 0) {
    fprintf(_stderr,"waiting..");
  }
  local_14 = 0;
  do {
    local_16 = 5;
    flash_chip_select(this);
    xfer_spi(this,(uint8_t *)&local_16,2);
    flash_chip_deselect(this);
    if ((local_16 & 0x100) == 0) {
      if (1 < local_14) {
        if ((this->verbose & 1U) != 0) {
          fprintf(_stderr,"R");
          fflush(_stderr);
        }
        if ((this->verbose & 1U) != 0) {
          fprintf(_stderr,"\n");
        }
        return;
      }
      local_14 = local_14 + 1;
      if ((this->verbose & 1U) != 0) {
        fprintf(_stderr,"r");
        fflush(_stderr);
      }
    }
    else {
      if ((this->verbose & 1U) != 0) {
        fprintf(_stderr,".");
        fflush(_stderr);
      }
      local_14 = 0;
    }
    local_24 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  } while( true );
}

Assistant:

void Spi::flash_wait() {
	if (verbose)
		fprintf(stderr, "waiting..");

	int count = 0;
	while (1) {
		uint8_t data[2] = { FC_RSR1 };

		flash_chip_select();
		xfer_spi(data, 2);
		flash_chip_deselect();

		if ((data[1] & 0x01) == 0) {
			if (count < 2) {
				count++;
				if (verbose) {
					fprintf(stderr, "r");
					fflush(stderr);
				}
			} else {
				if (verbose) {
					fprintf(stderr, "R");
					fflush(stderr);
				}
				break;
			}
		} else {
			if (verbose) {
				fprintf(stderr, ".");
				fflush(stderr);
			}
			count = 0;
		}

		std::this_thread::sleep_for(std::chrono::milliseconds(1));
	}

	if (verbose)
		fprintf(stderr, "\n");

}